

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

int shareedge(cbtInt3 *a,cbtInt3 *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar5 = 0;
  do {
    if (uVar5 == 3) {
      return 0;
    }
    uVar1 = uVar5 + 1;
    uVar3 = uVar1 & 0xffffffff;
    if (uVar1 == 3) {
      uVar3 = 0;
    }
    bVar7 = true;
    uVar6 = 0;
    do {
      uVar2 = uVar6 + 1;
      if ((&a->x)[uVar6] == (&b->x)[uVar3]) {
        uVar4 = uVar2;
        if (uVar6 == 2) {
          uVar4 = 0;
        }
        if ((&a->x)[uVar4] == (&b->x)[uVar5]) break;
      }
      bVar7 = uVar6 < 2;
      uVar6 = uVar2;
    } while (uVar2 != 3);
    uVar5 = uVar1;
    if (bVar7) {
      return 1;
    }
  } while( true );
}

Assistant:

int shareedge(const cbtInt3 &a, const cbtInt3 &b)
{
	int i;
	for (i = 0; i < 3; i++)
	{
		int i1 = (i + 1) % 3;
		if (hasedge(a, b[i1], b[i])) return 1;
	}
	return 0;
}